

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

SNMP_ERROR_STATUS __thiscall
StringCallback::setTypeWithValue(StringCallback *this,BER_CONTAINER *rawValue)

{
  char *__dest;
  ulong uVar1;
  char *__src;
  OctetType *val;
  BER_CONTAINER *rawValue_local;
  StringCallback *this_local;
  
  if (this->value == (char **)0x0) {
    this_local._4_4_ = GEN_ERR;
  }
  else {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 < this->max_len) {
      __dest = *this->value;
      __src = (char *)std::__cxx11::string::data();
      strncpy(__dest,__src,this->max_len);
      this_local._4_4_ = NO_ERROR;
    }
    else {
      this_local._4_4_ = WRONG_LENGTH;
    }
  }
  return this_local._4_4_;
}

Assistant:

SNMP_ERROR_STATUS StringCallback::setTypeWithValue(BER_CONTAINER* rawValue){
    ASSERT_CALLBACK_SETTABLE();
    ASSERT_VALID_SETTABLE_VALUE(this->value);

    OctetType* val = static_cast<OctetType*>(rawValue);
    if(val->_value.length() >= this->max_len) return WRONG_LENGTH;
    strncpy(*this->value, val->_value.data(), this->max_len);

    return NO_ERROR;
}